

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O1

void __thiscall TableCommand::TableCommand(TableCommand *this,path *fileName,Encoding encoding)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  path fullName;
  string local_58;
  path local_38;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__TableCommand_001cbbd0;
  EncodingTable::EncodingTable(&this->table);
  getFullPathName(&local_38,fileName);
  bVar1 = ghc::filesystem::exists(&local_38);
  if (bVar1) {
    bVar1 = EncodingTable::load(&this->table,&local_38,encoding);
    if (bVar1) goto LAB_00185ae4;
    ghc::filesystem::path::u8string_abi_cxx11_(&local_58,fileName);
    Logger::printError<std::__cxx11::string>((Logger *)0x1,0x195343,(char *)&local_58,in_RCX);
  }
  else {
    ghc::filesystem::path::u8string_abi_cxx11_(&local_58,fileName);
    Logger::printError<std::__cxx11::string>((Logger *)0x1,0x195324,(char *)&local_58,in_RCX);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
LAB_00185ae4:
  ghc::filesystem::path::~path(&local_38);
  return;
}

Assistant:

TableCommand::TableCommand(const fs::path& fileName, TextFile::Encoding encoding)
{
	auto fullName = getFullPathName(fileName);

	if (!fs::exists(fullName))
	{
		Logger::printError(Logger::Error, "Table file \"%s\" does not exist", fileName.u8string());
		return;
	}

	if (!table.load(fullName,encoding))
	{
		Logger::printError(Logger::Error, "Invalid table file \"%s\"",fileName.u8string());
		return;
	}
}